

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O0

int input_nnybble(uchar *infile,int n,uchar *array)

{
  byte bVar1;
  int iVar2;
  undefined1 *in_RDX;
  int in_ESI;
  uchar *in_RDI;
  int shift2;
  int shift1;
  int kk;
  int ii;
  int local_28;
  int local_24;
  uint local_4;
  
  if (in_ESI == 1) {
    iVar2 = input_nybble(in_RDI);
    *in_RDX = (char)iVar2;
    local_4 = 0;
  }
  else {
    if (bits_to_go == 8) {
      nextchar = nextchar + -1;
      bits_to_go = 0;
    }
    bVar1 = (byte)bits_to_go;
    local_28 = 0;
    if (bits_to_go == 0) {
      for (local_24 = 0; local_24 < in_ESI / 2; local_24 = local_24 + 1) {
        buffer2 = buffer2 << 8 | (uint)in_RDI[nextchar];
        nextchar = nextchar + 1;
        in_RDX[local_28] = (byte)(buffer2 >> 4) & 0xf;
        in_RDX[local_28 + 1] = (byte)buffer2 & 0xf;
        local_28 = local_28 + 2;
      }
    }
    else {
      for (local_24 = 0; local_24 < in_ESI / 2; local_24 = local_24 + 1) {
        buffer2 = buffer2 << 8 | (uint)in_RDI[nextchar];
        nextchar = nextchar + 1;
        in_RDX[local_28] = (byte)(buffer2 >> (bVar1 + 4 & 0x1f)) & 0xf;
        in_RDX[local_28 + 1] = (byte)(buffer2 >> (bVar1 & 0x1f)) & 0xf;
        local_28 = local_28 + 2;
      }
    }
    if (local_24 << 1 != in_ESI) {
      iVar2 = input_nybble(in_RDI);
      in_RDX[in_ESI + -1] = (char)iVar2;
    }
    local_4 = buffer2 >> ((byte)bits_to_go & 0x1f) & 0xf;
  }
  return local_4;
}

Assistant:

static int input_nnybble(unsigned char *infile, int n, unsigned char array[])
{
	/* copy n 4-bit nybbles from infile to the lower 4 bits of array */

int ii, kk, shift1, shift2;

/*  forcing byte alignment doesn;t help, and even makes it go slightly slower
if (bits_to_go != 8) input_nbits(infile, bits_to_go);
*/
	if (n == 1) {
		array[0] = input_nybble(infile);
		return(0);
	}
	
	if (bits_to_go == 8) {
		/*
		   already have 2 full nybbles in buffer2, so 
		   backspace the infile array to reuse last char
		*/
		nextchar--;
		bits_to_go = 0;
	}
	
	/* bits_to_go now has a value in the range 0 - 7.  After adding  */
	/* another byte, bits_to_go effectively will be in range 8 - 15 */	

	shift1 = bits_to_go + 4;   /* shift1 will be in range 4 - 11 */
	shift2 = bits_to_go;	   /* shift2 will be in range 0 -  7 */
	kk = 0;

	/* special case */
	if (bits_to_go == 0) 
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>4) & 15);
		array[kk + 1] = (int) ((buffer2) & 15);    /* no shift required */
		kk += 2;
	    }
	}
	else
	{
	    for (ii = 0; ii < n/2; ii++) {
		/*
		 * refill the buffer with next byte
		 */
		buffer2 = (buffer2<<8) | (int) infile[nextchar];
		nextchar++;
		array[kk]     = (int) ((buffer2>>shift1) & 15);
		array[kk + 1] = (int) ((buffer2>>shift2) & 15);
		kk += 2;
	    }
	}


	if (ii * 2 != n) {  /* have to read last odd byte */
		array[n-1] = input_nybble(infile);
	}

	return( (buffer2>>bits_to_go) & 15 ); 
}